

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O2

void get_pixels_in_1D_char_array_by_block_2x2(uint8_t *y_src,int stride,uint8_t *p_pixels_in1D)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  lVar1 = 0;
  for (iVar2 = 0; iVar2 != 2; iVar2 = iVar2 + 1) {
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      p_pixels_in1D[lVar3 + (int)lVar1] = y_src[lVar3];
    }
    y_src = y_src + stride;
    lVar1 = (long)(int)lVar1 + 2;
  }
  return;
}

Assistant:

static void get_pixels_in_1D_char_array_by_block_2x2(const uint8_t *y_src,
                                                     int stride,
                                                     uint8_t *p_pixels_in1D) {
  const uint8_t *p_pel = y_src;
  int index = 0;
  for (int i = 0; i < 2; i++) {
    for (int j = 0; j < 2; j++) {
      p_pixels_in1D[index++] = p_pel[j];
    }
    p_pel += stride;
  }
}